

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjFileParser.cpp
# Opt level: O1

void __thiscall Assimp::ObjFileParser::getMaterialDesc(ObjFileParser *this)

{
  Model *pMVar1;
  mapped_type pMVar2;
  size_type sVar3;
  int iVar4;
  uint uVar5;
  iterator iVar6;
  Logger *this_00;
  long *plVar7;
  Material *pMVar8;
  mapped_type *ppMVar9;
  byte *pbVar10;
  long *plVar11;
  byte *pbVar12;
  byte *pbVar13;
  size_t __n;
  bool bVar14;
  string strName;
  key_type local_498;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_478;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_458;
  undefined8 local_438;
  long local_430;
  long local_428;
  long lStack_420;
  
  pbVar13 = (byte *)(this->m_DataIt)._M_current;
  pbVar10 = (byte *)(this->m_DataItEnd)._M_current;
  pbVar12 = pbVar10 + -1;
  bVar14 = pbVar12 == pbVar13 || pbVar13 == pbVar10;
  if (pbVar12 != pbVar13 && pbVar13 != pbVar10) {
    do {
      if (((ulong)*pbVar13 < 0x21) && ((0x100003601U >> ((ulong)*pbVar13 & 0x3f) & 1) != 0)) {
        if (!bVar14) goto LAB_004acae7;
        break;
      }
      pbVar13 = pbVar13 + 1;
      bVar14 = pbVar13 == pbVar12 || pbVar13 == pbVar10;
    } while (pbVar13 != pbVar12 && pbVar13 != pbVar10);
  }
  goto LAB_004acb01;
  while (pbVar13 != pbVar12) {
LAB_004acae7:
    if (((*pbVar13 != 0x20) && (*pbVar13 != 9)) || (pbVar13 = pbVar13 + 1, pbVar13 == pbVar10))
    break;
  }
LAB_004acb01:
  (this->m_DataIt)._M_current = (char *)pbVar13;
  if (pbVar13 != pbVar10) {
    pbVar12 = (byte *)(this->m_DataIt)._M_current;
    while ((pbVar12 != pbVar10 && ((0xd < *pbVar12 || ((0x3401U >> (*pbVar12 & 0x1f) & 1) == 0)))))
    {
      pbVar12 = pbVar12 + 1;
      (this->m_DataIt)._M_current = (char *)pbVar12;
    }
    local_498._M_dataplus._M_p = (pointer)&local_498.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_498);
    local_478._M_dataplus._M_p = (pointer)&local_478.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_478,local_498._M_dataplus._M_p,
               local_498._M_dataplus._M_p + local_498._M_string_length);
    trim_whitespaces<std::__cxx11::string>(&local_478);
    std::__cxx11::string::operator=((string *)&local_498,(string *)&local_438);
    if (local_438 != &local_428) {
      operator_delete(local_438,local_428 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_478._M_dataplus._M_p != &local_478.field_2) {
      operator_delete(local_478._M_dataplus._M_p,local_478.field_2._M_allocated_capacity + 1);
    }
    sVar3 = local_498._M_string_length;
    bVar14 = local_498._M_string_length == 0;
    pMVar1 = (this->m_pModel)._M_t.
             super___uniq_ptr_impl<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>
             ._M_t.
             super__Tuple_impl<0UL,_Assimp::ObjFile::Model_*,_std::default_delete<Assimp::ObjFile::Model>_>
             .super__Head_base<0UL,_Assimp::ObjFile::Model_*,_false>._M_head_impl;
    pMVar8 = pMVar1->m_pCurrentMaterial;
    if (pMVar8 != (Material *)0x0) {
      __n = 0x3ff;
      if ((local_498._M_string_length & 0xfffffc00) == 0) {
        __n = local_498._M_string_length & 0xffffffff;
      }
      local_438 = (long *)CONCAT44(local_438._4_4_,(uint)__n);
      memcpy((void *)((long)&local_438 + 4),local_498._M_dataplus._M_p,__n);
      *(undefined1 *)((long)&local_438 + __n + 4) = 0;
      uVar5 = (pMVar8->MaterialName).length;
      if (uVar5 == (uint)__n) {
        iVar4 = bcmp((pMVar8->MaterialName).data,(void *)((long)&local_438 + 4),(ulong)uVar5);
        bVar14 = iVar4 == 0 || sVar3 == 0;
      }
    }
    if (!bVar14) {
      iVar6 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::ObjFile::Material_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::ObjFile::Material_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::ObjFile::Material_*>_>_>
              ::find(&(pMVar1->m_MaterialMap)._M_t,&local_498);
      pMVar1 = (this->m_pModel)._M_t.
               super___uniq_ptr_impl<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>
               ._M_t.
               super__Tuple_impl<0UL,_Assimp::ObjFile::Model_*,_std::default_delete<Assimp::ObjFile::Model>_>
               .super__Head_base<0UL,_Assimp::ObjFile::Model_*,_false>._M_head_impl;
      if (iVar6._M_node == (_Base_ptr)((long)&(pMVar1->m_MaterialMap)._M_t + 8U)) {
        this_00 = DefaultLogger::get();
        std::operator+(&local_458,"OBJ: failed to locate material ",&local_498);
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_458);
        plVar11 = plVar7 + 2;
        if ((long *)*plVar7 == plVar11) {
          local_428 = *plVar11;
          lStack_420 = plVar7[3];
          local_438 = &local_428;
        }
        else {
          local_428 = *plVar11;
          local_438 = (long *)*plVar7;
        }
        local_430 = plVar7[1];
        *plVar7 = (long)plVar11;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        Logger::error(this_00,(char *)local_438);
        if (local_438 != &local_428) {
          operator_delete(local_438,local_428 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_458._M_dataplus._M_p != &local_458.field_2) {
          operator_delete(local_458._M_dataplus._M_p,local_458.field_2._M_allocated_capacity + 1);
        }
        pMVar8 = (Material *)operator_new(0x409c);
        ObjFile::Material::Material(pMVar8);
        ((this->m_pModel)._M_t.
         super___uniq_ptr_impl<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>
         ._M_t.
         super__Tuple_impl<0UL,_Assimp::ObjFile::Model_*,_std::default_delete<Assimp::ObjFile::Model>_>
         .super__Head_base<0UL,_Assimp::ObjFile::Model_*,_false>._M_head_impl)->m_pCurrentMaterial =
             pMVar8;
        if (local_498._M_string_length < 0x400) {
          pMVar8 = ((this->m_pModel)._M_t.
                    super___uniq_ptr_impl<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_Assimp::ObjFile::Model_*,_std::default_delete<Assimp::ObjFile::Model>_>
                    .super__Head_base<0UL,_Assimp::ObjFile::Model_*,_false>._M_head_impl)->
                   m_pCurrentMaterial;
          (pMVar8->MaterialName).length = (int)local_498._M_string_length;
          memcpy((pMVar8->MaterialName).data,local_498._M_dataplus._M_p,local_498._M_string_length);
          *(undefined1 *)((long)(pMVar8->MaterialName).data + local_498._M_string_length) = 0;
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&((this->m_pModel)._M_t.
                      super___uniq_ptr_impl<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Assimp::ObjFile::Model_*,_std::default_delete<Assimp::ObjFile::Model>_>
                      .super__Head_base<0UL,_Assimp::ObjFile::Model_*,_false>._M_head_impl)->
                     m_MaterialLib,&local_498);
        pMVar1 = (this->m_pModel)._M_t.
                 super___uniq_ptr_impl<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_Assimp::ObjFile::Model_*,_std::default_delete<Assimp::ObjFile::Model>_>
                 .super__Head_base<0UL,_Assimp::ObjFile::Model_*,_false>._M_head_impl;
        pMVar2 = pMVar1->m_pCurrentMaterial;
        ppMVar9 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::ObjFile::Material_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::ObjFile::Material_*>_>_>
                  ::operator[](&pMVar1->m_MaterialMap,&local_498);
        *ppMVar9 = pMVar2;
      }
      else {
        pMVar1->m_pCurrentMaterial = *(Material **)(iVar6._M_node + 2);
      }
      bVar14 = needsNewMesh(this,&local_498);
      if (bVar14) {
        createMesh(this,&local_498);
      }
      uVar5 = getMaterialIndex(this,&local_498);
      ((this->m_pModel)._M_t.
       super___uniq_ptr_impl<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>.
       _M_t.
       super__Tuple_impl<0UL,_Assimp::ObjFile::Model_*,_std::default_delete<Assimp::ObjFile::Model>_>
       .super__Head_base<0UL,_Assimp::ObjFile::Model_*,_false>._M_head_impl)->m_pCurrentMesh->
      m_uiMaterialIndex = uVar5;
    }
    pbVar12 = (byte *)(this->m_DataIt)._M_current;
    pbVar13 = (byte *)(this->m_DataItEnd)._M_current;
    if (pbVar13 + -1 != pbVar12 && pbVar12 != pbVar13) {
      while ((0xd < *pbVar12 || ((0x3401U >> (*pbVar12 & 0x1f) & 1) == 0))) {
        pbVar12 = pbVar12 + 1;
        if ((pbVar12 == pbVar13) || (pbVar12 == pbVar13 + -1)) break;
      }
    }
    if (pbVar12 != pbVar13) {
      pbVar12 = pbVar12 + 1;
      this->m_uiLine = this->m_uiLine + 1;
    }
    pbVar10 = pbVar12;
    for (; (pbVar12 != pbVar13 && ((*pbVar12 == 0x20 || (pbVar10 = pbVar12, *pbVar12 == 9))));
        pbVar12 = pbVar12 + 1) {
      pbVar10 = pbVar13;
    }
    (this->m_DataIt)._M_current = (char *)pbVar10;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_498._M_dataplus._M_p != &local_498.field_2) {
      operator_delete(local_498._M_dataplus._M_p,local_498.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void ObjFileParser::getMaterialDesc() {
    // Get next data for material data
    m_DataIt = getNextToken<DataArrayIt>(m_DataIt, m_DataItEnd);
    if (m_DataIt == m_DataItEnd) {
        return;
    }

    char *pStart = &(*m_DataIt);
    while( m_DataIt != m_DataItEnd && !IsLineEnd( *m_DataIt ) ) {
        ++m_DataIt;
    }

    // In some cases we should ignore this 'usemtl' command, this variable helps us to do so
    bool skip = false;

    // Get name
    std::string strName(pStart, &(*m_DataIt));
    strName = trim_whitespaces(strName);
    if (strName.empty())
        skip = true;

    // If the current mesh has the same material, we simply ignore that 'usemtl' command
    // There is no need to create another object or even mesh here
    if ( m_pModel->m_pCurrentMaterial && m_pModel->m_pCurrentMaterial->MaterialName == aiString( strName ) ) {
        skip = true;
    }

    if (!skip) {
        // Search for material
        std::map<std::string, ObjFile::Material*>::iterator it = m_pModel->m_MaterialMap.find(strName);
        if (it == m_pModel->m_MaterialMap.end()) {
			// Not found, so we don't know anything about the material except for its name.
			// This may be the case if the material library is missing. We don't want to lose all
			// materials if that happens, so create a new named material instead of discarding it
			// completely.
            ASSIMP_LOG_ERROR("OBJ: failed to locate material " + strName + ", creating new material");
			m_pModel->m_pCurrentMaterial = new ObjFile::Material();
			m_pModel->m_pCurrentMaterial->MaterialName.Set(strName);
			m_pModel->m_MaterialLib.push_back(strName);
			m_pModel->m_MaterialMap[strName] = m_pModel->m_pCurrentMaterial;
        } else {
            // Found, using detected material
            m_pModel->m_pCurrentMaterial = (*it).second;
        }

        if ( needsNewMesh( strName ) ) {
            createMesh( strName );
        }

        m_pModel->m_pCurrentMesh->m_uiMaterialIndex = getMaterialIndex(strName);
    }

    // Skip rest of line
    m_DataIt = skipLine<DataArrayIt>( m_DataIt, m_DataItEnd, m_uiLine );
}